

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,vorbis_info_floor1 *info)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double b;
  double a_1;
  double denom;
  double weight;
  int x1;
  int x0;
  int i;
  double bn;
  double xyb;
  double y2b;
  double x2b;
  double yb;
  double xb;
  vorbis_info_floor1 *info_local;
  int *y1_local;
  int *y0_local;
  int fits_local;
  lsfit_acc *a_local;
  
  yb = 0.0;
  x2b = 0.0;
  y2b = 0.0;
  bn = 0.0;
  _x0 = 0.0;
  iVar1 = a->x0;
  iVar2 = a[fits + -1].x1;
  for (x1 = 0; x1 < fits; x1 = x1 + 1) {
    dVar3 = (double)(((float)(a[x1].bn + a[x1].an) * info->twofitweight) / (float)(a[x1].an + 1)) +
            1.0;
    yb = (double)a[x1].xa * dVar3 + (double)a[x1].xb + yb;
    x2b = (double)a[x1].ya * dVar3 + (double)a[x1].yb + x2b;
    y2b = (double)a[x1].x2a * dVar3 + (double)a[x1].x2b + y2b;
    bn = (double)a[x1].xya * dVar3 + (double)a[x1].xyb + bn;
    _x0 = (double)a[x1].an * dVar3 + (double)a[x1].bn + _x0;
  }
  if (-1 < *y0) {
    yb = (double)iVar1 + yb;
    x2b = (double)*y0 + x2b;
    y2b = (double)(iVar1 * iVar1) + y2b;
    bn = (double)(*y0 * iVar1) + bn;
    _x0 = _x0 + 1.0;
  }
  if (-1 < *y1) {
    yb = (double)iVar2 + yb;
    x2b = (double)*y1 + x2b;
    y2b = (double)(iVar2 * iVar2) + y2b;
    bn = (double)(*y1 * iVar2) + bn;
    _x0 = _x0 + 1.0;
  }
  dVar3 = _x0 * y2b + -(yb * yb);
  if (dVar3 <= 0.0) {
    *y0 = 0;
    *y1 = 0;
    a_local._4_4_ = 1;
  }
  else {
    dVar4 = (x2b * y2b + -(bn * yb)) / dVar3;
    dVar3 = (_x0 * bn + -(yb * x2b)) / dVar3;
    dVar5 = rint(dVar3 * (double)iVar1 + dVar4);
    *y0 = (int)dVar5;
    dVar3 = rint(dVar3 * (double)iVar2 + dVar4);
    *y1 = (int)dVar3;
    if (0x3ff < *y0) {
      *y0 = 0x3ff;
    }
    if (0x3ff < *y1) {
      *y1 = 0x3ff;
    }
    if (*y0 < 0) {
      *y0 = 0;
    }
    if (*y1 < 0) {
      *y1 = 0;
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,
                    vorbis_info_floor1 *info){
  double xb=0,yb=0,x2b=0,y2b=0,xyb=0,bn=0;
  int i;
  int x0=a[0].x0;
  int x1=a[fits-1].x1;

  for(i=0;i<fits;i++){
    double weight = (a[i].bn+a[i].an)*info->twofitweight/(a[i].an+1)+1.;

    xb+=a[i].xb + a[i].xa * weight;
    yb+=a[i].yb + a[i].ya * weight;
    x2b+=a[i].x2b + a[i].x2a * weight;
    y2b+=a[i].y2b + a[i].y2a * weight;
    xyb+=a[i].xyb + a[i].xya * weight;
    bn+=a[i].bn + a[i].an * weight;
  }

  if(*y0>=0){
    xb+=   x0;
    yb+=  *y0;
    x2b+=  x0 *  x0;
    y2b+= *y0 * *y0;
    xyb+= *y0 *  x0;
    bn++;
  }

  if(*y1>=0){
    xb+=   x1;
    yb+=  *y1;
    x2b+=  x1 *  x1;
    y2b+= *y1 * *y1;
    xyb+= *y1 *  x1;
    bn++;
  }

  {
    double denom=(bn*x2b-xb*xb);

    if(denom>0.){
      double a=(yb*x2b-xyb*xb)/denom;
      double b=(bn*xyb-xb*yb)/denom;
      *y0=rint(a+b*x0);
      *y1=rint(a+b*x1);

      /* limit to our range! */
      if(*y0>1023)*y0=1023;
      if(*y1>1023)*y1=1023;
      if(*y0<0)*y0=0;
      if(*y1<0)*y1=0;

      return 0;
    }else{
      *y0=0;
      *y1=0;
      return 1;
    }
  }
}